

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case0244(ParserTester *this)

{
  ParseOptions parseOpts;
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  ParseOptions local_230;
  allocator<psy::C::SyntaxKind> local_209;
  SyntaxKind local_208 [20];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"void ( * x ( double ) ) ( int ) { }",&local_31);
  Expectation::Expectation(&local_1b8);
  local_208[8] = ParameterSuffix;
  local_208[9] = ParameterDeclaration;
  local_208[10] = BasicTypeSpecifier;
  local_208[0xb] = AbstractDeclarator;
  local_208[0xc] = ParameterSuffix;
  local_208[0xd] = ParameterDeclaration;
  local_208[0xe] = BasicTypeSpecifier;
  local_208[0xf] = AbstractDeclarator;
  local_208[0] = STARTof_Node;
  local_208[1] = FunctionDefinition;
  local_208[2] = VoidTypeSpecifier;
  local_208[3] = FunctionDeclarator;
  local_208[4] = ParenthesizedDeclarator;
  local_208[5] = PointerDeclarator;
  local_208[6] = FunctionDeclarator;
  local_208[7] = IdentifierDeclarator;
  local_208[0x10] = 0x469;
  local_1e0 = local_208;
  local_1d8 = 0x11;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_209);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_209);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  ParseOptions::ParseOptions(&local_230);
  parseOpts.langExts_.translations_.field_0 = local_230.langExts_.translations_.field_0;
  parseOpts.langDialect_.std_ = local_230.langDialect_.std_;
  parseOpts._1_7_ = local_230._1_7_;
  parseOpts.langExts_.field_1.BF_all_ = local_230.langExts_.field_1.BF_all_;
  parseOpts.field_2 = local_230.field_2;
  parseOpts._26_6_ = local_230._26_6_;
  parse(this,&local_30,&local_100,Any,parseOpts);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_209);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case0244()
{
    // A function taking a parameter of type double and returning
    // a pointer to a function taking int as a parameter and
    // returning void.

    parse("void ( * x ( double ) ) ( int ) { }",
          Expectation().AST({ SyntaxKind::TranslationUnit,
                              SyntaxKind::FunctionDefinition,
                              SyntaxKind::VoidTypeSpecifier,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::ParenthesizedDeclarator,
                              SyntaxKind::PointerDeclarator,
                              SyntaxKind::FunctionDeclarator,
                              SyntaxKind::IdentifierDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::AbstractDeclarator,
                              SyntaxKind::ParameterSuffix,
                              SyntaxKind::ParameterDeclaration,
                              SyntaxKind::BasicTypeSpecifier,
                              SyntaxKind::AbstractDeclarator,
                              SyntaxKind::CompoundStatement }));
}